

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

bool __thiscall
cmGlobalGenerator::CheckCMP0037(cmGlobalGenerator *this,string *targetName,string *reason)

{
  cmake *this_00;
  bool bVar1;
  PolicyStatus PVar2;
  cmTarget *this_01;
  ostream *poVar3;
  string *psVar4;
  cmListFileBacktrace *backtrace;
  PolicyID id;
  bool bVar5;
  MessageType t;
  string local_1c8;
  ostringstream e;
  
  this_01 = FindTarget(this,targetName,false);
  if (this_01 == (cmTarget *)0x0) {
    return true;
  }
  this_00 = this->CMakeInstance;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  PVar2 = cmTarget::GetPolicyStatusCMP0037(this_01);
  if (PVar2 - NEW < 3) {
    t = FATAL_ERROR;
    bVar1 = true;
    bVar5 = false;
LAB_0041f029:
    poVar3 = std::operator<<((ostream *)&e,"The target name \"");
    psVar4 = cmTarget::GetName_abi_cxx11_(this_01);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    poVar3 = std::operator<<(poVar3,"\" is reserved ");
    poVar3 = std::operator<<(poVar3,(string *)reason);
    std::operator<<(poVar3,".");
    if (bVar5) {
      std::operator<<((ostream *)&e,"  It may result in undefined behavior.");
    }
    std::__cxx11::stringbuf::str();
    backtrace = cmTarget::GetBacktrace(this_01);
    cmake::IssueMessage(this_00,t,&local_1c8,backtrace);
    std::__cxx11::string::~string((string *)&local_1c8);
    if (bVar1) {
      bVar5 = false;
      goto LAB_0041f0ce;
    }
  }
  else if (PVar2 == WARN) {
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0x25,id);
    poVar3 = std::operator<<((ostream *)&e,(string *)&local_1c8);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_1c8);
    bVar1 = false;
    bVar5 = true;
    t = AUTHOR_WARNING;
    goto LAB_0041f029;
  }
  bVar5 = true;
LAB_0041f0ce:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return bVar5;
}

Assistant:

bool cmGlobalGenerator::CheckCMP0037(std::string const& targetName,
                                     std::string const& reason) const
{
  cmTarget* tgt = this->FindTarget(targetName);
  if (!tgt) {
    return true;
  }
  return RaiseCMP0037Message(this->GetCMakeInstance(), tgt, reason);
}